

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QUrl>::truncate
          (QGenericArrayOps<QUrl> *this,char *__file,__off_t __length)

{
  QUrl *pQVar1;
  QUrl *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QUrl> *this_00;
  
  pQVar1 = QArrayDataPointer<QUrl>::begin((QArrayDataPointer<QUrl> *)0x3c43e1);
  this_00 = (QArrayDataPointer<QUrl> *)(pQVar1 + (long)__file);
  QArrayDataPointer<QUrl>::end(this_00);
  std::destroy<QUrl*>((QUrl *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QUrl>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }